

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O1

string * __thiscall
duckdb::StringUtil::Format<std::__cxx11::string,int,int,int>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,int params_1,
          int params_2,int params_3)

{
  pointer pcVar1;
  int in_stack_ffffffffffffffa8;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (fmt_str->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + fmt_str->_M_string_length);
  Exception::ConstructMessage<std::__cxx11::string,int,int,int>
            (__return_storage_ptr__,(Exception *)this,&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)params & 0xffffffff),params_1,params_2,in_stack_ffffffffffffffa8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}